

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_objectwriter.cc
# Opt level: O2

JsonObjectWriter * __thiscall
google::protobuf::util::converter::JsonObjectWriter::RenderUint32
          (JsonObjectWriter *this,StringPiece name,uint32 value)

{
  stringpiece_ssize_type sVar1;
  JsonObjectWriter *pJVar2;
  AlphaNum *a;
  StringPiece value_00;
  AlphaNum local_80;
  string local_50;
  
  strings::AlphaNum::AlphaNum(&local_80,value);
  StrCat_abi_cxx11_(&local_50,(protobuf *)&local_80,a);
  sVar1 = StringPiece::CheckedSsizeTFromSizeT(local_50._M_string_length);
  value_00.length_ = sVar1;
  value_00.ptr_ = local_50._M_dataplus._M_p;
  pJVar2 = RenderSimple(this,name,value_00);
  std::__cxx11::string::~string((string *)&local_50);
  return pJVar2;
}

Assistant:

JsonObjectWriter* JsonObjectWriter::RenderUint32(StringPiece name,
                                                 uint32 value) {
  return RenderSimple(name, StrCat(value));
}